

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

void gc_scan_incref_child(JSRuntime *rt,JSGCObjectHeader *p)

{
  int iVar1;
  list_head *plVar2;
  list_head *plVar3;
  
  iVar1 = p->ref_count;
  p->ref_count = iVar1 + 1;
  if (iVar1 != 0) {
    return;
  }
  plVar2 = (p->link).prev;
  plVar3 = (p->link).next;
  plVar2->next = plVar3;
  plVar3->prev = plVar2;
  (p->link).prev = (list_head *)0x0;
  (p->link).next = (list_head *)0x0;
  plVar2 = (rt->gc_obj_list).prev;
  plVar2->next = &p->link;
  (p->link).prev = plVar2;
  (p->link).next = &rt->gc_obj_list;
  (rt->gc_obj_list).prev = &p->link;
  p->field_0x4 = p->field_0x4 & 0xf;
  return;
}

Assistant:

static void gc_scan_incref_child(JSRuntime *rt, JSGCObjectHeader *p)
{
    p->ref_count++;
    if (p->ref_count == 1) {
        /* ref_count was 0: remove from tmp_obj_list and add at the
           end of gc_obj_list */
        list_del(&p->link);
        list_add_tail(&p->link, &rt->gc_obj_list);
        p->mark = 0; /* reset the mark for the next GC call */
    }
}